

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O2

int cargo_fprint_args(FILE *f,int argc,char **argv,int start,cargo_fprint_flags_t flags,
                     size_t max_width,size_t highlight_count,...)

{
  char in_AL;
  char *ptr;
  int iVar1;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  undefined1 local_c8 [48];
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  ap[0].reg_save_area = local_c8;
  ap[0].overflow_arg_area = &stack0x00000010;
  ap[0].gp_offset = 0x30;
  ap[0].fp_offset = 0x30;
  ptr = cargo_get_vfprint_args(argc,argv,start,flags,max_width,highlight_count,ap);
  if (ptr == (char *)0x0) {
    iVar1 = -1;
  }
  else {
    iVar1 = 0;
    fprintf((FILE *)f,"%s\n",ptr);
    _cargo_free(ptr);
  }
  return iVar1;
}

Assistant:

int cargo_fprint_args(FILE *f, int argc, char **argv, int start,
                      cargo_fprint_flags_t flags, size_t max_width,
                      size_t highlight_count, ...)
{
    char *ret;
    va_list ap;
    va_start(ap, highlight_count);
    ret = cargo_get_vfprint_args(argc, argv, start, flags,
                                max_width, highlight_count, ap);
    va_end(ap);

    if (!ret)
    {
        return -1;
    }

    fprintf(f, "%s\n", ret);
    _cargo_free(ret);
    return 0;
}